

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall
pstore::file::in_memory::write_buffer(in_memory *this,not_null<const_void_*> ptr,size_t nbytes)

{
  ulong uVar1;
  element_type *peVar2;
  ulong uVar3;
  span<const_unsigned_char,__1L> src_span;
  span<unsigned_char,__1L> dest_span;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_e0;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_d0;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_c0;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_b0;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_a0;
  span<const_unsigned_char,__1L> local_90;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_80;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_40;
  
  if (this->writable_ == false) {
    raise<std::errc>(permission_denied);
  }
  uVar3 = this->length_;
  uVar1 = this->pos_;
  if (uVar3 <= uVar1) {
    assert_failed("length_ > pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xd5);
  }
  if (uVar3 - uVar1 < nbytes) {
    raise<std::errc>(invalid_argument);
  }
  if (-1 < (long)(uVar3 | nbytes | uVar1)) {
    peVar2 = (this->buffer_).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_e0,uVar3);
    local_e0.index_ = (ptrdiff_t)peVar2;
    local_80 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_e0,this->pos_,nbytes);
    gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_e0,nbytes);
    local_90.storage_.super_extent_type<_1L>.size_ = (index_type)local_e0.span_;
    local_90.storage_.data_ = (pointer)ptr.ptr_;
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_a0,&local_90,0);
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_b0,&local_90,local_90.storage_.super_extent_type<_1L>.size_);
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_c0,(span<unsigned_char,__1L> *)&local_80,0);
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_40,local_a0.span_,local_a0.index_);
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_e0,local_40.span_,local_40.index_);
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_60,local_b0.span_,local_b0.index_);
    gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::span_iterator
              (&local_50,local_60.span_,local_60.index_);
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_70,local_c0.span_,local_c0.index_);
    std::
    __copy_move_a<false,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
              (&local_d0,&local_e0,
               (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&local_50);
    uVar3 = nbytes + this->pos_;
    if (!CARRY8(nbytes,this->pos_)) {
      this->pos_ = uVar3;
      if (this->eof_ < uVar3) {
        this->eof_ = uVar3;
      }
      return;
    }
    assert_failed("pos_ + nbytes >= pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xee);
  }
  assert_failed("length_ <= max && pos_ <= max && nbytes <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0xe1);
}

Assistant:

void in_memory::check_writable () const {
            if (!writable_) {
                raise (std::errc::permission_denied);
            }
        }